

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O0

Item * protect_astmt(Item *q1,Item *q2)

{
  Item *pIVar1;
  Item *in_RSI;
  Item *q;
  char *in_stack_ffffffffffffffe8;
  
  replacstr(in_RSI,in_stack_ffffffffffffffe8);
  pIVar1 = insertstr(in_RSI,in_stack_ffffffffffffffe8);
  protect_include_ = 1;
  return pIVar1;
}

Assistant:

Item* protect_astmt(Item* q1, Item* q2) { /* PROTECT, ';' */
	Item* q;
	replacstr(q1, "#pragma acc atomic update\n");
	q = insertstr(q2->next, "\n");
	protect_include_ = 1;
	return q;
}